

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

string * getHomePath_abi_cxx11_(void)

{
  long lVar1;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  string *extraout_RAX;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *in_RDI;
  allocator local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  __s = getenv("QGREP_HOME");
  if (__s == (char *)0x0) {
    __s = getenv("HOME");
  }
  pcVar2 = getenv("HOMEDRIVE");
  pcVar3 = getenv("HOMEPATH");
  if (((__s == (char *)0x0) && (pcVar2 == (char *)0x0)) && (pcVar3 == (char *)0x0)) {
    *in_RDI = (long)(in_RDI + 2);
    std::__cxx11::string::_M_construct<char_const*>();
    return extraout_RAX;
  }
  if (__s == (char *)0x0) {
    std::__cxx11::string::string((string *)local_48,pcVar2,&local_69);
    plVar5 = (long *)std::__cxx11::string::append((char *)local_48);
    local_68 = &local_58;
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar7) {
      local_58._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_58._8_8_ = plVar5[3];
    }
    else {
      local_58._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar5;
    }
    local_60 = plVar5[1];
    *plVar5 = (long)paVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_68 = &local_58;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar4);
  }
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_68);
  *in_RDI = (long)(in_RDI + 2);
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    lVar1 = puVar6[3];
    in_RDI[2] = *plVar5;
    in_RDI[3] = lVar1;
  }
  else {
    *in_RDI = (long)*puVar6;
    in_RDI[2] = *plVar5;
  }
  in_RDI[1] = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  paVar7 = &local_58;
  if (local_68 != paVar7) {
    operator_delete(local_68);
    paVar7 = extraout_RAX_00;
  }
  if (__s == (char *)0x0) {
    paVar7 = &local_38;
    if (local_48[0] != paVar7) {
      operator_delete(local_48[0]);
      paVar7 = extraout_RAX_01;
    }
  }
  return (string *)paVar7;
}

Assistant:

static std::string getHomePath()
{
    char* qghome = getenv("QGREP_HOME");
    char* home = qghome ? qghome : getenv("HOME");
	const char* drive = getenv("HOMEDRIVE");
	const char* path = getenv("HOMEPATH");

    if (!home && !drive && !path) return "";

	return (home ? std::string(home) : std::string(drive) + path) + "/.qgrep";
}